

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int MMDB_get_entry_data_list(MMDB_entry_s *start,MMDB_entry_data_list_s **entry_data_list)

{
  MMDB_data_pool_s *pool_00;
  MMDB_entry_data_list_s *pMVar1;
  int status;
  MMDB_entry_data_list_s *list;
  MMDB_data_pool_s *pool;
  MMDB_entry_data_list_s **entry_data_list_local;
  MMDB_entry_s *start_local;
  
  *entry_data_list = (MMDB_entry_data_list_s *)0x0;
  pool_00 = data_pool_new(0x40);
  if (pool_00 == (MMDB_data_pool_s *)0x0) {
    start_local._4_4_ = 5;
  }
  else {
    pMVar1 = data_pool_alloc(pool_00);
    if (pMVar1 == (MMDB_entry_data_list_s *)0x0) {
      data_pool_destroy(pool_00);
      start_local._4_4_ = 5;
    }
    else {
      start_local._4_4_ = get_entry_data_list(start->mmdb,start->offset,pMVar1,pool_00,0);
      if (start_local._4_4_ == 0) {
        pMVar1 = data_pool_to_list(pool_00);
        *entry_data_list = pMVar1;
        if (*entry_data_list == (MMDB_entry_data_list_s *)0x0) {
          data_pool_destroy(pool_00);
          start_local._4_4_ = 5;
        }
      }
      else {
        data_pool_destroy(pool_00);
      }
    }
  }
  return start_local._4_4_;
}

Assistant:

int MMDB_get_entry_data_list(MMDB_entry_s *start,
                             MMDB_entry_data_list_s **const entry_data_list) {
    *entry_data_list = NULL;

    MMDB_data_pool_s *const pool = data_pool_new(MMDB_POOL_INIT_SIZE);
    if (!pool) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    MMDB_entry_data_list_s *const list = data_pool_alloc(pool);
    if (!list) {
        data_pool_destroy(pool);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    int const status =
        get_entry_data_list(start->mmdb, start->offset, list, pool, 0);
    if (MMDB_SUCCESS != status) {
        data_pool_destroy(pool);
        return status;
    }

    *entry_data_list = data_pool_to_list(pool);
    if (!*entry_data_list) {
        data_pool_destroy(pool);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    return status;
}